

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O1

AggregateFunction *
duckdb::GetHistogramFunction<true>(AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType *in_RDX;
  
  switch(type->physical_type_) {
  case BOOL:
    GetMapTypeInternal<duckdb::HistogramFunctor,bool,duckdb::DefaultMapType<std::map<bool,unsigned_long,std::less<bool>,std::allocator<std::pair<bool_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case UINT8:
    GetMapTypeInternal<duckdb::HistogramFunctor,unsigned_char,duckdb::DefaultMapType<std::map<unsigned_char,unsigned_long,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case INT8:
    GetMapTypeInternal<duckdb::HistogramFunctor,signed_char,duckdb::DefaultMapType<std::map<signed_char,unsigned_long,std::less<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case UINT16:
    GetMapTypeInternal<duckdb::HistogramFunctor,unsigned_short,duckdb::DefaultMapType<std::map<unsigned_short,unsigned_long,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case INT16:
    GetMapTypeInternal<duckdb::HistogramFunctor,short,duckdb::DefaultMapType<std::map<short,unsigned_long,std::less<short>,std::allocator<std::pair<short_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case UINT32:
    GetMapTypeInternal<duckdb::HistogramFunctor,unsigned_int,duckdb::DefaultMapType<std::map<unsigned_int,unsigned_long,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case INT32:
    GetMapTypeInternal<duckdb::HistogramFunctor,int,duckdb::DefaultMapType<std::map<int,unsigned_long,std::less<int>,std::allocator<std::pair<int_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case UINT64:
    GetMapTypeInternal<duckdb::HistogramFunctor,unsigned_long,duckdb::DefaultMapType<std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case INT64:
    GetMapTypeInternal<duckdb::HistogramFunctor,long,duckdb::DefaultMapType<std::map<long,unsigned_long,std::less<long>,std::allocator<std::pair<long_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case FLOAT:
    GetMapTypeInternal<duckdb::HistogramFunctor,float,duckdb::DefaultMapType<std::map<float,unsigned_long,std::less<float>,std::allocator<std::pair<float_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case DOUBLE:
    GetMapTypeInternal<duckdb::HistogramFunctor,double,duckdb::DefaultMapType<std::map<double,unsigned_long,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  default:
    if (type->physical_type_ == VARCHAR) {
      GetMapTypeInternal<duckdb::HistogramStringFunctor,duckdb::string_t,duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::map<duckdb::string_t,unsigned_long,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      return __return_storage_ptr__;
    }
  case UINT64|UINT8:
    GetMapTypeInternal<duckdb::HistogramGenericFunctor,duckdb::string_t,duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::map<duckdb::string_t,unsigned_long,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
  }
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetHistogramFunction(const LogicalType &type) {
	switch (type.InternalType()) {
#ifndef DUCKDB_SMALLER_BINARY
	case PhysicalType::BOOL:
		return GetMapType<HistogramFunctor, bool, IS_ORDERED>(type);
	case PhysicalType::UINT8:
		return GetMapType<HistogramFunctor, uint8_t, IS_ORDERED>(type);
	case PhysicalType::UINT16:
		return GetMapType<HistogramFunctor, uint16_t, IS_ORDERED>(type);
	case PhysicalType::UINT32:
		return GetMapType<HistogramFunctor, uint32_t, IS_ORDERED>(type);
	case PhysicalType::UINT64:
		return GetMapType<HistogramFunctor, uint64_t, IS_ORDERED>(type);
	case PhysicalType::INT8:
		return GetMapType<HistogramFunctor, int8_t, IS_ORDERED>(type);
	case PhysicalType::INT16:
		return GetMapType<HistogramFunctor, int16_t, IS_ORDERED>(type);
	case PhysicalType::INT32:
		return GetMapType<HistogramFunctor, int32_t, IS_ORDERED>(type);
	case PhysicalType::INT64:
		return GetMapType<HistogramFunctor, int64_t, IS_ORDERED>(type);
	case PhysicalType::FLOAT:
		return GetMapType<HistogramFunctor, float, IS_ORDERED>(type);
	case PhysicalType::DOUBLE:
		return GetMapType<HistogramFunctor, double, IS_ORDERED>(type);
	case PhysicalType::VARCHAR:
		return GetStringMapType<HistogramStringFunctor, IS_ORDERED>(type);
#endif
	default:
		return GetStringMapType<HistogramGenericFunctor, IS_ORDERED>(type);
	}
}